

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

char * fio_sha2_result(fio_sha2_s *s)

{
  fio_sha2_variant_e fVar1;
  ulong uVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  uint uVar39;
  uint_fast64_t tmp;
  ulong uVar40;
  ulong uVar41;
  size_t __n;
  uint8_t *__src;
  uint8_t *data;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  uVar39 = (uint)(s->length).words[0];
  if ((s->type & SHA_512) == 0) {
    uVar39 = uVar39 & 0x3f;
    uVar40 = (ulong)uVar39;
    if (uVar40 < 0x38) {
      if (uVar39 == 0x37) {
        s->buffer[0x37] = 0x80;
      }
      else {
        memcpy(s->buffer + uVar40,sha2_padding,0x38 - uVar40);
      }
    }
    else {
      memcpy(s->buffer + uVar40,sha2_padding,0x40 - uVar40);
      fio_sha2_perform_all_rounds(s,s->buffer);
      s->buffer[0x20] = '\0';
      s->buffer[0x21] = '\0';
      s->buffer[0x22] = '\0';
      s->buffer[0x23] = '\0';
      s->buffer[0x24] = '\0';
      s->buffer[0x25] = '\0';
      s->buffer[0x26] = '\0';
      s->buffer[0x27] = '\0';
      s->buffer[0x28] = '\0';
      s->buffer[0x29] = '\0';
      s->buffer[0x2a] = '\0';
      s->buffer[0x2b] = '\0';
      s->buffer[0x2c] = '\0';
      s->buffer[0x2d] = '\0';
      s->buffer[0x2e] = '\0';
      s->buffer[0x2f] = '\0';
      s->buffer[0x10] = '\0';
      s->buffer[0x11] = '\0';
      s->buffer[0x12] = '\0';
      s->buffer[0x13] = '\0';
      s->buffer[0x14] = '\0';
      s->buffer[0x15] = '\0';
      s->buffer[0x16] = '\0';
      s->buffer[0x17] = '\0';
      s->buffer[0x18] = '\0';
      s->buffer[0x19] = '\0';
      s->buffer[0x1a] = '\0';
      s->buffer[0x1b] = '\0';
      s->buffer[0x1c] = '\0';
      s->buffer[0x1d] = '\0';
      s->buffer[0x1e] = '\0';
      s->buffer[0x1f] = '\0';
      s->buffer[0] = '\0';
      s->buffer[1] = '\0';
      s->buffer[2] = '\0';
      s->buffer[3] = '\0';
      s->buffer[4] = '\0';
      s->buffer[5] = '\0';
      s->buffer[6] = '\0';
      s->buffer[7] = '\0';
      s->buffer[8] = '\0';
      s->buffer[9] = '\0';
      s->buffer[10] = '\0';
      s->buffer[0xb] = '\0';
      s->buffer[0xc] = '\0';
      s->buffer[0xd] = '\0';
      s->buffer[0xe] = '\0';
      s->buffer[0xf] = '\0';
      s->buffer[0x30] = '\0';
      s->buffer[0x31] = '\0';
      s->buffer[0x32] = '\0';
      s->buffer[0x33] = '\0';
      s->buffer[0x34] = '\0';
      s->buffer[0x35] = '\0';
      s->buffer[0x36] = '\0';
      s->buffer[0x37] = '\0';
    }
    uVar40 = (s->length).words[0] << 3;
    *(ulong *)(s->buffer + 0x38) =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | (s->length).words[0] << 0x3b;
    fio_sha2_perform_all_rounds(s,s->buffer);
    auVar42 = *(undefined1 (*) [16])&s->digest;
    auVar43 = *(undefined1 (*) [16])((long)&s->digest + 0x10);
    auVar44[1] = 0;
    auVar44[0] = auVar42[8];
    auVar44[2] = auVar42[9];
    auVar44[3] = 0;
    auVar44[4] = auVar42[10];
    auVar44[5] = 0;
    auVar44[6] = auVar42[0xb];
    auVar44[7] = 0;
    auVar44[8] = auVar42[0xc];
    auVar44[9] = 0;
    auVar44[10] = auVar42[0xd];
    auVar44[0xb] = 0;
    auVar44[0xc] = auVar42[0xe];
    auVar44[0xd] = 0;
    auVar44[0xe] = auVar42[0xf];
    auVar44[0xf] = 0;
    auVar45 = pshuflw(auVar44,auVar44,0x1b);
    auVar45 = pshufhw(auVar45,auVar45,0x1b);
    auVar19[0xd] = 0;
    auVar19._0_13_ = auVar42._0_13_;
    auVar19[0xe] = auVar42[7];
    auVar21[0xc] = auVar42[6];
    auVar21._0_12_ = auVar42._0_12_;
    auVar21._13_2_ = auVar19._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar42._0_11_;
    auVar23._12_3_ = auVar21._12_3_;
    auVar25[10] = auVar42[5];
    auVar25._0_10_ = auVar42._0_10_;
    auVar25._11_4_ = auVar23._11_4_;
    auVar27[9] = 0;
    auVar27._0_9_ = auVar42._0_9_;
    auVar27._10_5_ = auVar25._10_5_;
    auVar29[8] = auVar42[4];
    auVar29._0_8_ = auVar42._0_8_;
    auVar29._9_6_ = auVar27._9_6_;
    auVar33._7_8_ = 0;
    auVar33._0_7_ = auVar29._8_7_;
    auVar35._1_8_ = SUB158(auVar33 << 0x40,7);
    auVar35[0] = auVar42[3];
    auVar35._9_6_ = 0;
    auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
    auVar36[0] = auVar42[2];
    auVar36._11_4_ = 0;
    auVar31[2] = auVar42[1];
    auVar31._0_2_ = auVar42._0_2_;
    auVar31._3_12_ = SUB1512(auVar36 << 0x20,3);
    auVar42._0_2_ = auVar42._0_2_ & 0xff;
    auVar42._2_13_ = auVar31._2_13_;
    auVar42[0xf] = 0;
    auVar42 = pshuflw(auVar42,auVar42,0x1b);
    auVar42 = pshufhw(auVar42,auVar42,0x1b);
    sVar3 = auVar42._0_2_;
    sVar4 = auVar42._2_2_;
    sVar5 = auVar42._4_2_;
    sVar6 = auVar42._6_2_;
    sVar7 = auVar42._8_2_;
    sVar8 = auVar42._10_2_;
    sVar9 = auVar42._12_2_;
    sVar10 = auVar42._14_2_;
    sVar11 = auVar45._0_2_;
    sVar12 = auVar45._2_2_;
    sVar13 = auVar45._4_2_;
    sVar14 = auVar45._6_2_;
    sVar15 = auVar45._8_2_;
    sVar16 = auVar45._10_2_;
    sVar17 = auVar45._12_2_;
    sVar18 = auVar45._14_2_;
    (s->digest).str[0] = (0 < sVar3) * (sVar3 < 0x100) * auVar42[0] - (0xff < sVar3);
    (s->digest).str[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar42[2] - (0xff < sVar4);
    (s->digest).str[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar42[4] - (0xff < sVar5);
    (s->digest).str[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar42[6] - (0xff < sVar6);
    (s->digest).str[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[8] - (0xff < sVar7);
    (s->digest).str[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[10] - (0xff < sVar8);
    (s->digest).str[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar42[0xc] - (0xff < sVar9);
    (s->digest).str[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar42[0xe] - (0xff < sVar10);
    (s->digest).str[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar45[0] - (0xff < sVar11);
    (s->digest).str[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar45[2] - (0xff < sVar12);
    (s->digest).str[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar45[4] - (0xff < sVar13);
    (s->digest).str[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar45[6] - (0xff < sVar14);
    (s->digest).str[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar45[8] - (0xff < sVar15);
    (s->digest).str[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar45[10] - (0xff < sVar16);
    (s->digest).str[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar45[0xc] - (0xff < sVar17);
    (s->digest).str[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar45[0xe] - (0xff < sVar18);
    auVar45[1] = 0;
    auVar45[0] = auVar43[8];
    auVar45[2] = auVar43[9];
    auVar45[3] = 0;
    auVar45[4] = auVar43[10];
    auVar45[5] = 0;
    auVar45[6] = auVar43[0xb];
    auVar45[7] = 0;
    auVar45[8] = auVar43[0xc];
    auVar45[9] = 0;
    auVar45[10] = auVar43[0xd];
    auVar45[0xb] = 0;
    auVar45[0xc] = auVar43[0xe];
    auVar45[0xd] = 0;
    auVar45[0xe] = auVar43[0xf];
    auVar45[0xf] = 0;
    auVar42 = pshuflw(auVar45,auVar45,0x1b);
    auVar45 = pshufhw(auVar42,auVar42,0x1b);
    auVar20[0xd] = 0;
    auVar20._0_13_ = auVar43._0_13_;
    auVar20[0xe] = auVar43[7];
    auVar22[0xc] = auVar43[6];
    auVar22._0_12_ = auVar43._0_12_;
    auVar22._13_2_ = auVar20._13_2_;
    auVar24[0xb] = 0;
    auVar24._0_11_ = auVar43._0_11_;
    auVar24._12_3_ = auVar22._12_3_;
    auVar26[10] = auVar43[5];
    auVar26._0_10_ = auVar43._0_10_;
    auVar26._11_4_ = auVar24._11_4_;
    auVar28[9] = 0;
    auVar28._0_9_ = auVar43._0_9_;
    auVar28._10_5_ = auVar26._10_5_;
    auVar30[8] = auVar43[4];
    auVar30._0_8_ = auVar43._0_8_;
    auVar30._9_6_ = auVar28._9_6_;
    auVar34._7_8_ = 0;
    auVar34._0_7_ = auVar30._8_7_;
    auVar37._1_8_ = SUB158(auVar34 << 0x40,7);
    auVar37[0] = auVar43[3];
    auVar37._9_6_ = 0;
    auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
    auVar38[0] = auVar43[2];
    auVar38._11_4_ = 0;
    auVar32[2] = auVar43[1];
    auVar32._0_2_ = auVar43._0_2_;
    auVar32._3_12_ = SUB1512(auVar38 << 0x20,3);
    auVar43._0_2_ = auVar43._0_2_ & 0xff;
    auVar43._2_13_ = auVar32._2_13_;
    auVar43[0xf] = 0;
    auVar42 = pshuflw((undefined1  [16])0x0,auVar43,0x1b);
    auVar42 = pshufhw(auVar42,auVar42,0x1b);
    sVar3 = auVar42._0_2_;
    sVar4 = auVar42._2_2_;
    sVar5 = auVar42._4_2_;
    sVar6 = auVar42._6_2_;
    sVar7 = auVar42._8_2_;
    sVar8 = auVar42._10_2_;
    sVar9 = auVar42._12_2_;
    sVar10 = auVar42._14_2_;
    sVar11 = auVar45._0_2_;
    sVar12 = auVar45._2_2_;
    sVar13 = auVar45._4_2_;
    sVar14 = auVar45._6_2_;
    sVar15 = auVar45._8_2_;
    sVar16 = auVar45._10_2_;
    sVar17 = auVar45._12_2_;
    sVar18 = auVar45._14_2_;
    (s->digest).str[0x10] = (0 < sVar3) * (sVar3 < 0x100) * auVar42[0] - (0xff < sVar3);
    (s->digest).str[0x11] = (0 < sVar4) * (sVar4 < 0x100) * auVar42[2] - (0xff < sVar4);
    (s->digest).str[0x12] = (0 < sVar5) * (sVar5 < 0x100) * auVar42[4] - (0xff < sVar5);
    (s->digest).str[0x13] = (0 < sVar6) * (sVar6 < 0x100) * auVar42[6] - (0xff < sVar6);
    (s->digest).str[0x14] = (0 < sVar7) * (sVar7 < 0x100) * auVar42[8] - (0xff < sVar7);
    (s->digest).str[0x15] = (0 < sVar8) * (sVar8 < 0x100) * auVar42[10] - (0xff < sVar8);
    (s->digest).str[0x16] = (0 < sVar9) * (sVar9 < 0x100) * auVar42[0xc] - (0xff < sVar9);
    (s->digest).str[0x17] = (0 < sVar10) * (sVar10 < 0x100) * auVar42[0xe] - (0xff < sVar10);
    (s->digest).str[0x18] = (0 < sVar11) * (sVar11 < 0x100) * auVar45[0] - (0xff < sVar11);
    (s->digest).str[0x19] = (0 < sVar12) * (sVar12 < 0x100) * auVar45[2] - (0xff < sVar12);
    (s->digest).str[0x1a] = (0 < sVar13) * (sVar13 < 0x100) * auVar45[4] - (0xff < sVar13);
    (s->digest).str[0x1b] = (0 < sVar14) * (sVar14 < 0x100) * auVar45[6] - (0xff < sVar14);
    (s->digest).str[0x1c] = (0 < sVar15) * (sVar15 < 0x100) * auVar45[8] - (0xff < sVar15);
    (s->digest).str[0x1d] = (0 < sVar16) * (sVar16 < 0x100) * auVar45[10] - (0xff < sVar16);
    (s->digest).str[0x1e] = (0 < sVar17) * (sVar17 < 0x100) * auVar45[0xc] - (0xff < sVar17);
    (s->digest).str[0x1f] = (0 < sVar18) * (sVar18 < 0x100) * auVar45[0xe] - (0xff < sVar18);
    if (s->type != SHA_224) goto LAB_00134be5;
  }
  else {
    uVar39 = uVar39 & 0x7f;
    uVar40 = (ulong)uVar39;
    if (uVar40 < 0x70) {
      if (uVar39 != 0x6f) {
        data = s->buffer + uVar40;
        __n = 0x70 - uVar40;
        __src = sha2_padding;
        goto LAB_00134ae3;
      }
      s->buffer[0x6f] = 0x80;
    }
    else {
      data = s->buffer;
      memcpy(s->buffer + uVar40,sha2_padding,0x80 - uVar40);
      fio_sha2_perform_all_rounds(s,data);
      __src = sha2_padding + 1;
      __n = 0x70;
LAB_00134ae3:
      memcpy(data,__src,__n);
    }
    uVar40 = (s->length).words[0];
    uVar2 = (s->length).words[1] << 3;
    uVar41 = uVar40 << 3;
    uVar41 = uVar41 >> 0x38 | (uVar41 & 0xff000000000000) >> 0x28 |
             (uVar41 & 0xff0000000000) >> 0x18 | (uVar41 & 0xff00000000) >> 8 |
             (uVar41 & 0xff000000) << 8 | (uVar41 & 0xff0000) << 0x18 | (uVar41 & 0xff00) << 0x28 |
             uVar40 << 0x3b;
    uVar40 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | (uVar2 | uVar40 >> 0x3d) << 0x38;
    (s->length).words[0] = uVar40;
    (s->length).words[1] = uVar41;
    *(ulong *)(s->buffer + 0x70) = uVar40;
    *(ulong *)(s->buffer + 0x78) = uVar41;
    fio_sha2_perform_all_rounds(s,s->buffer);
    uVar40 = (s->digest).i64[0];
    uVar2 = (s->digest).i64[1];
    (s->digest).i64[0] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    (s->digest).i64[1] =
         uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
         (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
         (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
    uVar40 = (s->digest).i64[2];
    (s->digest).i64[2] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    uVar40 = (s->digest).i64[3];
    (s->digest).i64[3] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    uVar40 = (s->digest).i64[4];
    (s->digest).i64[4] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    uVar40 = (s->digest).i64[5];
    (s->digest).i64[5] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    uVar40 = (s->digest).i64[6];
    (s->digest).i64[6] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    uVar40 = (s->digest).i64[7];
    (s->digest).i64[7] =
         uVar40 >> 0x38 | (uVar40 & 0xff000000000000) >> 0x28 | (uVar40 & 0xff0000000000) >> 0x18 |
         (uVar40 & 0xff00000000) >> 8 | (uVar40 & 0xff000000) << 8 | (uVar40 & 0xff0000) << 0x18 |
         (uVar40 & 0xff00) << 0x28 | uVar40 << 0x38;
    fVar1 = s->type;
    if (fVar1 == SHA_512_256) {
      (s->digest).str[0x20] = '\0';
      goto LAB_00134be5;
    }
    if (fVar1 == SHA_384) {
      (s->digest).str[0x30] = '\0';
      goto LAB_00134be5;
    }
    if (fVar1 != SHA_512_224) {
      (s->digest).str[0x40] = '\0';
      goto LAB_00134be5;
    }
  }
  (s->digest).str[0x1c] = '\0';
LAB_00134be5:
  return (char *)&s->digest;
}

Assistant:

char *fio_sha2_result(fio_sha2_s *s) {
  if (s->type & 1) {
    /* 512 bits derived hashing */

    size_t in_buffer = s->length.words[0] & 127;

    if (in_buffer > 111) {
      memcpy(s->buffer + in_buffer, sha2_padding, 128 - in_buffer);
      fio_sha2_perform_all_rounds(s, s->buffer);
      memcpy(s->buffer, sha2_padding + 1, 112);
    } else if (in_buffer != 111) {
      memcpy(s->buffer + in_buffer, sha2_padding, 112 - in_buffer);
    } else {
      s->buffer[111] = sha2_padding[0];
    }
    /* store the length in BITS - alignment should be promised by struct */
    /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */

    s->length.words[1] = (s->length.words[1] << 3) | (s->length.words[0] >> 61);
    s->length.words[0] = s->length.words[0] << 3;
    s->length.words[0] = fio_lton64(s->length.words[0]);
    s->length.words[1] = fio_lton64(s->length.words[1]);

#if !__BIG_ENDIAN__
    {
      uint_fast64_t tmp = s->length.words[0];
      s->length.words[0] = s->length.words[1];
      s->length.words[1] = tmp;
    }
#endif

    uint64_t *len = (uint64_t *)(s->buffer + 112);
    len[0] = s->length.words[0];
    len[1] = s->length.words[1];
    fio_sha2_perform_all_rounds(s, s->buffer);

    /* change back to little endian */
    s->digest.i64[0] = fio_ntol64(s->digest.i64[0]);
    s->digest.i64[1] = fio_ntol64(s->digest.i64[1]);
    s->digest.i64[2] = fio_ntol64(s->digest.i64[2]);
    s->digest.i64[3] = fio_ntol64(s->digest.i64[3]);
    s->digest.i64[4] = fio_ntol64(s->digest.i64[4]);
    s->digest.i64[5] = fio_ntol64(s->digest.i64[5]);
    s->digest.i64[6] = fio_ntol64(s->digest.i64[6]);
    s->digest.i64[7] = fio_ntol64(s->digest.i64[7]);
    // set NULL bytes for SHA-2 Type
    switch (s->type) {
    case SHA_512_224:
      s->digest.str[28] = 0;
      break;
    case SHA_512_256:
      s->digest.str[32] = 0;
      break;
    case SHA_384:
      s->digest.str[48] = 0;
      break;
    default:
      s->digest.str[64] =
          0; /* sometimes the optimizer messes the NUL sequence */
      break;
    }
    // fprintf(stderr, "result requested, in hex, is:");
    // for (size_t i = 0; i < ((s->type & 1) ? 64 : 32); i++)
    //   fprintf(stderr, "%02x", (unsigned int)(s->digest.str[i] & 0xFF));
    // fprintf(stderr, "\r\n");
    return (char *)s->digest.str;
  }

  size_t in_buffer = s->length.words[0] & 63;
  if (in_buffer > 55) {
    memcpy(s->buffer + in_buffer, sha2_padding, 64 - in_buffer);
    fio_sha2_perform_all_rounds(s, s->buffer);
    memcpy(s->buffer, sha2_padding + 1, 56);
  } else if (in_buffer != 55) {
    memcpy(s->buffer + in_buffer, sha2_padding, 56 - in_buffer);
  } else {
    s->buffer[55] = sha2_padding[0];
  }
  /* store the length in BITS - alignment should be promised by struct */
  /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */
  uint64_t *len = (uint64_t *)(s->buffer + 56);
  *len = s->length.words[0] << 3;
  *len = fio_lton64(*len);
  fio_sha2_perform_all_rounds(s, s->buffer);

  /* change back to little endian, if required */

  s->digest.i32[0] = fio_ntol32(s->digest.i32[0]);
  s->digest.i32[1] = fio_ntol32(s->digest.i32[1]);
  s->digest.i32[2] = fio_ntol32(s->digest.i32[2]);
  s->digest.i32[3] = fio_ntol32(s->digest.i32[3]);
  s->digest.i32[4] = fio_ntol32(s->digest.i32[4]);
  s->digest.i32[5] = fio_ntol32(s->digest.i32[5]);
  s->digest.i32[6] = fio_ntol32(s->digest.i32[6]);
  s->digest.i32[7] = fio_ntol32(s->digest.i32[7]);

  // set NULL bytes for SHA_224
  if (s->type == SHA_224)
    s->digest.str[28] = 0;
  // fprintf(stderr, "SHA-2 result requested, in hex, is:");
  // for (size_t i = 0; i < ((s->type & 1) ? 64 : 32); i++)
  //   fprintf(stderr, "%02x", (unsigned int)(s->digest.str[i] & 0xFF));
  // fprintf(stderr, "\r\n");
  return (char *)s->digest.str;
}